

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_String UA_DateTime_toString(UA_DateTime t)

{
  size_t i;
  UA_Byte *pUVar1;
  long lVar2;
  size_t sVar3;
  UA_String UVar4;
  undefined1 local_32 [8];
  UA_DateTimeStruct tSt;
  
  pUVar1 = (UA_Byte *)malloc(0x20);
  if (pUVar1 == (UA_Byte *)0x0) {
    sVar3 = 0;
  }
  else {
    UA_DateTime_toStruct((UA_DateTimeStruct *)local_32,t);
    lVar2 = 2;
    do {
      pUVar1[lVar2 + -1] = (char)tSt.sec + (char)(tSt.sec / 10) * -10 | 0x30;
      lVar2 = lVar2 + -1;
      tSt.sec = tSt.sec / 10;
    } while (lVar2 != 0);
    pUVar1[2] = '/';
    lVar2 = 4;
    do {
      pUVar1[lVar2] = (char)tSt.milliSec + (char)(tSt.milliSec / 10) * -10 | 0x30;
      lVar2 = lVar2 + -1;
      tSt.milliSec = tSt.milliSec / 10;
    } while (lVar2 != 2);
    pUVar1[5] = '/';
    lVar2 = 4;
    do {
      pUVar1[lVar2 + 5] = (char)tSt.min + (char)(tSt.min / 10) * -10 | 0x30;
      lVar2 = lVar2 + -1;
      tSt.min = tSt.min / 10;
    } while (lVar2 != 0);
    pUVar1[10] = ' ';
    lVar2 = 0;
    do {
      pUVar1[lVar2 + 0xc] = (char)tSt.microSec + (char)(tSt.microSec / 10) * -10 | 0x30;
      lVar2 = lVar2 + -1;
      tSt.microSec = tSt.microSec / 10;
    } while (lVar2 != -2);
    pUVar1[0xd] = ':';
    lVar2 = 0;
    do {
      pUVar1[lVar2 + 0xf] = (char)tSt.nanoSec + (char)(tSt.nanoSec / 10) * -10 | 0x30;
      lVar2 = lVar2 + -1;
      tSt.nanoSec = tSt.nanoSec / 10;
    } while (lVar2 != -2);
    pUVar1[0x10] = ':';
    lVar2 = 0;
    do {
      pUVar1[lVar2 + 0x12] = (char)local_32._6_2_ + (char)((ushort)local_32._6_2_ / 10) * -10 | 0x30
      ;
      lVar2 = lVar2 + -1;
      local_32._6_2_ = (ushort)local_32._6_2_ / 10;
    } while (lVar2 != -2);
    pUVar1[0x13] = '.';
    lVar2 = 0;
    do {
      pUVar1[lVar2 + 0x16] = (char)local_32._4_2_ + (char)((ushort)local_32._4_2_ / 10) * -10 | 0x30
      ;
      lVar2 = lVar2 + -1;
      local_32._4_2_ = (ushort)local_32._4_2_ / 10;
    } while (lVar2 != -3);
    pUVar1[0x17] = '.';
    lVar2 = 0;
    do {
      pUVar1[lVar2 + 0x1a] = (char)local_32._2_2_ + (char)((ushort)local_32._2_2_ / 10) * -10 | 0x30
      ;
      lVar2 = lVar2 + -1;
      local_32._2_2_ = (ushort)local_32._2_2_ / 10;
    } while (lVar2 != -3);
    pUVar1[0x1b] = '.';
    lVar2 = 0;
    do {
      pUVar1[lVar2 + 0x1e] = (char)local_32._0_2_ + (char)((ushort)local_32._0_2_ / 10) * -10 | 0x30
      ;
      lVar2 = lVar2 + -1;
      local_32._0_2_ = (ushort)local_32._0_2_ / 10;
    } while (lVar2 != -3);
    sVar3 = 0x1f;
  }
  UVar4.data = pUVar1;
  UVar4.length = sVar3;
  return UVar4;
}

Assistant:

UA_String
UA_DateTime_toString(UA_DateTime t) {
    UA_String str = UA_STRING_NULL;
    // length of the string is 31 (plus \0 at the end)
    if(!(str.data = (UA_Byte*)UA_malloc(32)))
        return str;
    str.length = 31;
    UA_DateTimeStruct tSt = UA_DateTime_toStruct(t);
    printNumber(tSt.month, str.data, 2);
    str.data[2] = '/';
    printNumber(tSt.day, &str.data[3], 2);
    str.data[5] = '/';
    printNumber(tSt.year, &str.data[6], 4);
    str.data[10] = ' ';
    printNumber(tSt.hour, &str.data[11], 2);
    str.data[13] = ':';
    printNumber(tSt.min, &str.data[14], 2);
    str.data[16] = ':';
    printNumber(tSt.sec, &str.data[17], 2);
    str.data[19] = '.';
    printNumber(tSt.milliSec, &str.data[20], 3);
    str.data[23] = '.';
    printNumber(tSt.microSec, &str.data[24], 3);
    str.data[27] = '.';
    printNumber(tSt.nanoSec, &str.data[28], 3);
    return str;
}